

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>::on_num
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>
           *this)

{
  char cVar1;
  uchar uVar2;
  uint uVar3;
  undefined1 *puVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  _Alloc_hider _Var11;
  _Alloc_hider _Var12;
  size_type sVar13;
  uint uVar14;
  long lVar15;
  char *pcVar16;
  basic_format_specs<char> *specs;
  basic_format_specs<char> *pbVar17;
  uint uVar18;
  basic_string_view<char> s;
  string groups;
  char digits [40];
  string local_298;
  undefined1 auStack_278 [48];
  undefined1 local_248 [536];
  
  grouping_impl<char>(&local_298,(locale_ref)(this->locale).locale_);
  if (local_298._M_string_length == 0) {
    on_dec(this);
  }
  else {
    uVar2 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
    if (uVar2 == '\0') {
      on_dec(this);
    }
    else {
      uVar8 = this->abs_value;
      uVar7 = (ulong)uVar8;
      uVar10 = 0x1f;
      if ((uVar8 | 1) != 0) {
        for (; (uVar8 | 1) >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      uVar3 = (uVar10 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
      uVar18 = uVar3 + (*(uint *)(basic_data<void>::zero_or_powers_of_10_32 + (ulong)uVar3 * 4) <=
                       uVar8);
      pcVar16 = local_298._M_dataplus._M_p + local_298._M_string_length;
      _Var11._M_p = local_298._M_dataplus._M_p;
      uVar10 = uVar18;
      uVar5 = uVar18;
      if (local_298._M_string_length != 0) {
        _Var12._M_p = local_298._M_dataplus._M_p;
        sVar13 = local_298._M_string_length;
        uVar9 = uVar18;
        do {
          cVar1 = *_Var12._M_p;
          uVar14 = uVar5 - (int)cVar1;
          _Var11._M_p = _Var12._M_p;
          uVar10 = uVar9;
          if ((uVar14 == 0 || (int)uVar5 < (int)cVar1) || ((byte)(cVar1 + 0x81U) < 0x82)) break;
          uVar9 = uVar9 + 1;
          _Var12._M_p = _Var12._M_p + 1;
          sVar13 = sVar13 - 1;
          _Var11._M_p = pcVar16;
          uVar10 = (int)local_298._M_string_length +
                   uVar3 + (*(uint *)(basic_data<void>::zero_or_powers_of_10_32 + (ulong)uVar3 * 4)
                           <= uVar8);
          uVar5 = uVar14;
        } while (sVar13 != 0);
      }
      if (_Var11._M_p == pcVar16) {
        uVar10 = uVar10 + (int)(uVar5 - 1) / (int)pcVar16[-1];
      }
      puVar4 = auStack_278 + uVar18;
      if (99 < uVar8) {
        do {
          uVar5 = (uint)uVar7;
          uVar8 = (uint)(uVar7 / 100);
          uVar7 = uVar7 / 100;
          *(undefined2 *)(puVar4 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar5 + (int)uVar7 * -100) * 2);
          puVar4 = puVar4 + -2;
        } while (9999 < uVar5);
      }
      if (uVar8 < 10) {
        puVar4[-1] = (byte)uVar8 | 0x30;
      }
      else {
        *(undefined2 *)(puVar4 + -2) = *(undefined2 *)(basic_data<void>::digits + (ulong)uVar8 * 2);
      }
      local_248._16_8_ = 0;
      local_248._0_8_ = &PTR_grow_00137bd8;
      local_248._8_8_ = (buffer<char> *)(local_248 + 0x20);
      local_248._24_8_ = 500;
      uVar10 = uVar10 + this->prefix_size;
      pcVar16 = (char *)(long)(int)uVar10;
      if (500 < uVar10) {
        basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
                  ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_248,
                   (size_t)pcVar16);
      }
      local_248._16_8_ = pcVar16;
      specs = (basic_format_specs<char> *)(pcVar16 + local_248._8_8_);
      if (uVar18 != 0) {
        lVar15 = (ulong)uVar18 + 1;
        iVar6 = 0;
        _Var11._M_p = local_298._M_dataplus._M_p;
        pbVar17 = specs;
        do {
          specs = (basic_format_specs<char> *)&pbVar17[-1].field_0xf;
          pbVar17[-1].field_0xf = auStack_278[(int)lVar15 - 2];
          cVar1 = *_Var11._M_p;
          if ('\0' < cVar1) {
            iVar6 = iVar6 + 1;
            if ((cVar1 != '\x7f') && (iVar6 % (int)cVar1 == 0)) {
              if (_Var11._M_p + 1 != local_298._M_dataplus._M_p + local_298._M_string_length) {
                iVar6 = 0;
                _Var11._M_p = _Var11._M_p + 1;
              }
              pbVar17[-1].fill.size_ = uVar2;
              specs = (basic_format_specs<char> *)&pbVar17[-1].fill.size_;
            }
          }
          lVar15 = lVar15 + -1;
          pbVar17 = specs;
        } while (1 < lVar15);
      }
      if (this->prefix_size != 0) {
        specs[-1].field_0xf = 0x2d;
      }
      s.size_ = (size_t)this->specs;
      s.data_ = pcVar16;
      write<char,char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                ((detail *)(this->out).container,
                 (back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_248._8_8_,s,specs);
      local_248._0_8_ = &PTR_grow_00137bd8;
      if ((buffer<char> *)local_248._8_8_ != (buffer<char> *)(local_248 + 0x20)) {
        operator_delete((void *)local_248._8_8_);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += prefix_size;
    buffer.resize(size);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size;
    for (int i = num_digits - 1; i >= 0; --i) {
      *--p = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      p -= s.size();
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
    }
    if (prefix_size != 0) p[-1] = static_cast<Char>('-');
    write(out, basic_string_view<Char>(buffer.data(), buffer.size()), specs);
  }